

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

void refresh_ds(flatcc_builder_t *B,flatbuffers_uoffset_t type_limit)

{
  flatcc_iovec_t *buf;
  flatbuffers_uoffset_t type_limit_local;
  flatcc_builder_t *B_local;
  
  B->ds = (uint8_t *)((long)B->buffers[1].iov_base + (ulong)B->ds_first);
  B->ds_limit = (int)B->buffers[1].iov_len - B->ds_first;
  if (type_limit < B->ds_limit) {
    B->ds_limit = type_limit;
  }
  B->frame->type_limit = type_limit;
  return;
}

Assistant:

static inline void refresh_ds(flatcc_builder_t *B, uoffset_t type_limit)
{
    iovec_t *buf = B->buffers + flatcc_builder_alloc_ds;

    B->ds = ds_ptr(B->ds_first);
    B->ds_limit = (uoffset_t)buf->iov_len - B->ds_first;
    /*
     * So we don't allocate outside tables representation size, nor our
     * current buffer size.
     */
    if (B->ds_limit > type_limit) {
        B->ds_limit = type_limit;
    }
    /* So exit frame can refresh fast. */
    frame(type_limit) = type_limit;
}